

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test2::prepareProgram
          (GPUShaderFP64Test2 *this,shaderStage shader_stage,uniformTypeDetails *uniform_type,
          programInfo *out_program_info)

{
  uint uVar1;
  GLchar *pGVar2;
  GLchar *pGVar3;
  GLchar *pGVar4;
  GLchar *pGVar5;
  ulong uVar6;
  GLchar *local_170;
  GLchar *vs_c_str;
  GLchar *tes_c_str;
  GLchar *tcs_c_str;
  GLchar *gs_c_str;
  GLchar *fs_c_str;
  GLchar *cs_c_str;
  undefined1 local_130 [8];
  string uniform_verification;
  string uniform_definitions;
  string vertex_shader_code;
  string tess_eval_shader_code;
  string tess_ctrl_shader_code;
  string geometry_shader_code;
  string fragment_shader_code;
  string compute_shader_code;
  GLuint n_varyings;
  programInfo *out_program_info_local;
  uniformTypeDetails *uniform_type_local;
  shaderStage shader_stage_local;
  GPUShaderFP64Test2 *this_local;
  
  compute_shader_code.field_2._12_4_ = 1;
  std::__cxx11::string::string((string *)(fragment_shader_code.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(geometry_shader_code.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(tess_ctrl_shader_code.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(tess_eval_shader_code.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(vertex_shader_code.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(uniform_definitions.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(uniform_verification.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_130);
  prepareUniformDefinitions
            (this,shader_stage,uniform_type,
             (string *)(uniform_verification.field_2._M_local_buf + 8));
  prepareUniformVerification(this,shader_stage,uniform_type,(string *)local_130);
  if (shader_stage == FRAGMENT_SHADER) {
    prepareBoilerplateShader
              (this,"",prepareProgram::corner_vertex_shader_body_code,
               (string *)((long)&uniform_definitions.field_2 + 8));
  }
  else if (shader_stage - GEOMETRY_SHADER < 3) {
    prepareBoilerplateShader
              (this,"",prepareProgram::boilerplate_vertex_shader_body_code,
               (string *)((long)&uniform_definitions.field_2 + 8));
  }
  else if (shader_stage == VERTEX_SHADER) {
    pGVar2 = (GLchar *)std::__cxx11::string::c_str();
    pGVar4 = prepareProgram::test_shader_out_variable;
    pGVar3 = (GLchar *)std::__cxx11::string::c_str();
    prepareTestShader(this,"",pGVar2,"",pGVar4,pGVar3,prepareProgram::test_shader_body_code,
                      (string *)((long)&uniform_definitions.field_2 + 8));
  }
  if (shader_stage == FRAGMENT_SHADER) {
    pGVar2 = (GLchar *)std::__cxx11::string::c_str();
    pGVar4 = prepareProgram::test_fragment_shader_out_variable;
    pGVar3 = (GLchar *)std::__cxx11::string::c_str();
    prepareTestShader(this,"",pGVar2,"",pGVar4,pGVar3,prepareProgram::test_shader_body_code,
                      (string *)((long)&geometry_shader_code.field_2 + 8));
  }
  else if (shader_stage - GEOMETRY_SHADER < 4) {
    prepareBoilerplateShader
              (this,"",prepareProgram::boilerplate_fragment_shader_body_code,
               (string *)((long)&geometry_shader_code.field_2 + 8));
  }
  pGVar2 = prepareProgram::tess_ctrl_shader_layout_code;
  pGVar4 = prepareProgram::geometry_shader_layout_code;
  switch(shader_stage) {
  case COMPUTE_SHADER:
    pGVar4 = (GLchar *)std::__cxx11::string::c_str();
    pGVar2 = (GLchar *)std::__cxx11::string::c_str();
    prepareTestComputeShader(this,pGVar4,pGVar2,(string *)((long)&fragment_shader_code.field_2 + 8))
    ;
    break;
  default:
    break;
  case GEOMETRY_SHADER:
    pGVar3 = (GLchar *)std::__cxx11::string::c_str();
    pGVar2 = prepareProgram::test_shader_out_variable;
    pGVar5 = (GLchar *)std::__cxx11::string::c_str();
    prepareTestShader(this,pGVar4,pGVar3,"",pGVar2,pGVar5,
                      prepareProgram::test_geometry_shader_body_code,
                      (string *)((long)&tess_ctrl_shader_code.field_2 + 8));
    break;
  case TESS_CTRL_SHADER:
    pGVar3 = (GLchar *)std::__cxx11::string::c_str();
    pGVar4 = prepareProgram::test_tess_ctrl_shader_out_variable;
    pGVar5 = (GLchar *)std::__cxx11::string::c_str();
    prepareTestShader(this,pGVar2,pGVar3,"",pGVar4,pGVar5,
                      prepareProgram::test_tess_ctrl_shader_body_code,
                      (string *)((long)&tess_eval_shader_code.field_2 + 8));
    prepareTestShader(this,prepareProgram::tess_eval_shader_layout_code,"",
                      prepareProgram::test_tess_ctrl_shader_in_variable,
                      prepareProgram::test_shader_out_variable,"",
                      prepareProgram::passthrough_tess_eval_shader_body_code,
                      (string *)((long)&vertex_shader_code.field_2 + 8));
    break;
  case TESS_EVAL_SHADER:
    prepareBoilerplateShader
              (this,prepareProgram::tess_ctrl_shader_layout_code,
               prepareProgram::boilerplate_tess_ctrl_shader_body_code,
               (string *)((long)&tess_eval_shader_code.field_2 + 8));
    pGVar4 = prepareProgram::tess_eval_shader_layout_code;
    pGVar3 = (GLchar *)std::__cxx11::string::c_str();
    pGVar2 = prepareProgram::test_shader_out_variable;
    pGVar5 = (GLchar *)std::__cxx11::string::c_str();
    prepareTestShader(this,pGVar4,pGVar3,"",pGVar2,pGVar5,prepareProgram::test_shader_body_code,
                      (string *)((long)&vertex_shader_code.field_2 + 8));
  }
  fs_c_str = (GLchar *)0x0;
  gs_c_str = (GLchar *)0x0;
  tcs_c_str = (GLchar *)0x0;
  tes_c_str = (GLchar *)0x0;
  vs_c_str = (GLchar *)0x0;
  local_170 = (GLchar *)0x0;
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    fs_c_str = (GLchar *)std::__cxx11::string::c_str();
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    gs_c_str = (GLchar *)std::__cxx11::string::c_str();
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    tcs_c_str = (GLchar *)std::__cxx11::string::c_str();
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    tes_c_str = (GLchar *)std::__cxx11::string::c_str();
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    vs_c_str = (GLchar *)std::__cxx11::string::c_str();
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_170 = (GLchar *)std::__cxx11::string::c_str();
  }
  if ((shader_stage == COMPUTE_SHADER) || (shader_stage == FRAGMENT_SHADER)) {
    compute_shader_code.field_2._12_4_ = 0;
  }
  Utils::programInfo::build
            (out_program_info,fs_c_str,gs_c_str,tcs_c_str,tes_c_str,vs_c_str,local_170,
             &prepareProgram::varying_name,compute_shader_code.field_2._12_4_);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::~string((string *)(uniform_verification.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(uniform_definitions.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(vertex_shader_code.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(tess_eval_shader_code.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(tess_ctrl_shader_code.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(geometry_shader_code.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(fragment_shader_code.field_2._M_local_buf + 8));
  return;
}

Assistant:

void GPUShaderFP64Test2::prepareProgram(shaderStage shader_stage, const uniformTypeDetails& uniform_type,
										Utils::programInfo& out_program_info) const
{
	/* Stage specific layouts */
	static const glw::GLchar* geometry_shader_layout_code = "layout(points)                   in;\n"
															"layout(points, max_vertices = 1) out;\n"
															"\n";

	static const glw::GLchar* tess_ctrl_shader_layout_code = "layout(vertices = 1) out;\n"
															 "\n";

	static const glw::GLchar* tess_eval_shader_layout_code = "layout(isolines, point_mode) in;\n"
															 "\n";

	/* Stage specific main body */
	static const glw::GLchar* boilerplate_fragment_shader_body_code = "    discard;\n";

	static const glw::GLchar* boilerplate_tess_ctrl_shader_body_code = "    gl_TessLevelOuter[0] = 1.0;\n"
																	   "    gl_TessLevelOuter[1] = 1.0;\n"
																	   "    gl_TessLevelOuter[2] = 1.0;\n"
																	   "    gl_TessLevelOuter[3] = 1.0;\n"
																	   "    gl_TessLevelInner[0] = 1.0;\n"
																	   "    gl_TessLevelInner[1] = 1.0;\n";

	static const glw::GLchar* boilerplate_vertex_shader_body_code = "    gl_Position = vec4(1, 0, 0, 1);\n";

	static const glw::GLchar* corner_vertex_shader_body_code = "    if (0 == gl_VertexID)\n"
															   "    {\n"
															   "        gl_Position = vec4(-1, -1, 0, 1);\n"
															   "    }\n"
															   "    else if (1 == gl_VertexID)\n"
															   "    {\n"
															   "        gl_Position = vec4(-1, 1, 0, 1);\n"
															   "    }\n"
															   "    else if (2 == gl_VertexID)\n"
															   "    {\n"
															   "        gl_Position = vec4(1, 1, 0, 1);\n"
															   "    }\n"
															   "    else if (3 == gl_VertexID)\n"
															   "    {\n"
															   "        gl_Position = vec4(1, -1, 0, 1);\n"
															   "    }\n";

	static const glw::GLchar* passthrough_tess_eval_shader_body_code = "    result = tcs_tes_result[0];\n";

	static const glw::GLchar* test_shader_body_code = "\n    result = verification_result;\n";

	static const glw::GLchar* test_geometry_shader_body_code = "\n    result = verification_result;\n"
															   "\n"
															   "    EmitVertex();\n"
															   "    EndPrimitive();\n";

	static const glw::GLchar* test_tess_ctrl_shader_body_code =
		"\n    tcs_tes_result[gl_InvocationID] = verification_result;\n"
		"\n"
		"    gl_TessLevelOuter[0] = 1.0;\n"
		"    gl_TessLevelOuter[1] = 1.0;\n"
		"    gl_TessLevelOuter[2] = 1.0;\n"
		"    gl_TessLevelOuter[3] = 1.0;\n"
		"    gl_TessLevelInner[0] = 1.0;\n"
		"    gl_TessLevelInner[1] = 1.0;\n";

	/* In variables */
	static const glw::GLchar* test_tess_ctrl_shader_in_variable = "in  int tcs_tes_result[];\n";

	/* Out variables */
	static const glw::GLchar* test_fragment_shader_out_variable = "layout(location = 0) out int result;\n";

	static const glw::GLchar* test_tess_ctrl_shader_out_variable = "out int tcs_tes_result[];\n";

	static const glw::GLchar* test_shader_out_variable = "out int result;\n";

	/* Varying name */
	static const glw::GLchar* varying_name = "result";
	glw::GLuint				  n_varyings   = 1;

	/* Storage for ready shaders */
	std::string compute_shader_code;
	std::string fragment_shader_code;
	std::string geometry_shader_code;
	std::string tess_ctrl_shader_code;
	std::string tess_eval_shader_code;
	std::string vertex_shader_code;

	/* Storage for uniform definition and verification code */
	std::string uniform_definitions;
	std::string uniform_verification;

	/* Get uniform definition and verification code */
	prepareUniformDefinitions(shader_stage, uniform_type, uniform_definitions);
	prepareUniformVerification(shader_stage, uniform_type, uniform_verification);

	/* Prepare vertex shader */
	switch (shader_stage)
	{
	case FRAGMENT_SHADER:

		prepareBoilerplateShader("", corner_vertex_shader_body_code, vertex_shader_code);

		break;

	case GEOMETRY_SHADER:
	case TESS_CTRL_SHADER:
	case TESS_EVAL_SHADER:

		prepareBoilerplateShader("", boilerplate_vertex_shader_body_code, vertex_shader_code);

		break;

	case VERTEX_SHADER:

		prepareTestShader("" /* layout */, uniform_definitions.c_str() /* uniforms */, "" /* in var */,
						  test_shader_out_variable /* out var */, uniform_verification.c_str() /* verification */,
						  test_shader_body_code /* body */, vertex_shader_code);

		break;

	default:
		break;
	}

	/* Prepare fragment shader */
	switch (shader_stage)
	{
	case FRAGMENT_SHADER:

		prepareTestShader("" /* layout */, uniform_definitions.c_str() /* uniforms */, "" /* in var */,
						  test_fragment_shader_out_variable /* out var */,
						  uniform_verification.c_str() /* verification */, test_shader_body_code /* body */,
						  fragment_shader_code);

		break;

	case GEOMETRY_SHADER:
	case TESS_CTRL_SHADER:
	case TESS_EVAL_SHADER:
	case VERTEX_SHADER:

		prepareBoilerplateShader("" /* layout */, boilerplate_fragment_shader_body_code /* body */,
								 fragment_shader_code);

		break;

	default:
		break;
	}

	/* Prepare compute, tess_ctrl, tess_eval, geometry shaders */
	switch (shader_stage)
	{
	case COMPUTE_SHADER:

		prepareTestComputeShader(uniform_definitions.c_str(), uniform_verification.c_str(), compute_shader_code);

		break;

	case GEOMETRY_SHADER:

		prepareTestShader(geometry_shader_layout_code /* layout */, uniform_definitions.c_str() /* uniforms */,
						  "" /* in var */, test_shader_out_variable /* out var */,
						  uniform_verification.c_str() /* verification */, test_geometry_shader_body_code /* body */,
						  geometry_shader_code);

		break;

	case TESS_CTRL_SHADER:

		prepareTestShader(tess_ctrl_shader_layout_code /* layout */, uniform_definitions.c_str() /* uniforms */,
						  "" /* in var */, test_tess_ctrl_shader_out_variable /* out var */,
						  uniform_verification.c_str() /* verification */, test_tess_ctrl_shader_body_code /* body */,
						  tess_ctrl_shader_code);

		prepareTestShader(tess_eval_shader_layout_code /* layout */, "" /* uniforms */,
						  test_tess_ctrl_shader_in_variable /* in var */, test_shader_out_variable /* out var */,
						  "" /* verification */, passthrough_tess_eval_shader_body_code /* body */,
						  tess_eval_shader_code);

		break;

	case TESS_EVAL_SHADER:

		prepareBoilerplateShader(tess_ctrl_shader_layout_code /* layout */,
								 boilerplate_tess_ctrl_shader_body_code /* body */, tess_ctrl_shader_code);

		prepareTestShader(tess_eval_shader_layout_code /* layout */, uniform_definitions.c_str() /* uniforms */,
						  "" /* in var */, test_shader_out_variable /* out var */,
						  uniform_verification.c_str() /* verification */, test_shader_body_code /* body */,
						  tess_eval_shader_code);

		break;

	default:
		break;
	};

	/* Select shaders that will be used by program */
	const glw::GLchar* cs_c_str  = 0;
	const glw::GLchar* fs_c_str  = 0;
	const glw::GLchar* gs_c_str  = 0;
	const glw::GLchar* tcs_c_str = 0;
	const glw::GLchar* tes_c_str = 0;
	const glw::GLchar* vs_c_str  = 0;

	if (false == compute_shader_code.empty())
	{
		cs_c_str = compute_shader_code.c_str();
	}

	if (false == fragment_shader_code.empty())
	{
		fs_c_str = fragment_shader_code.c_str();
	}

	if (false == geometry_shader_code.empty())
	{
		gs_c_str = geometry_shader_code.c_str();
	}

	if (false == tess_ctrl_shader_code.empty())
	{
		tcs_c_str = tess_ctrl_shader_code.c_str();
	}

	if (false == tess_eval_shader_code.empty())
	{
		tes_c_str = tess_eval_shader_code.c_str();
	}

	if (false == vertex_shader_code.empty())
	{
		vs_c_str = vertex_shader_code.c_str();
	}

	/* Compute and fragment shader results are stored in texture, do not set varyings for transfrom feedback */
	if ((COMPUTE_SHADER == shader_stage) || (FRAGMENT_SHADER == shader_stage))
	{
		n_varyings = 0;
	}

	/* Build */
	out_program_info.build(cs_c_str, fs_c_str, gs_c_str, tcs_c_str, tes_c_str, vs_c_str, &varying_name, n_varyings);
}